

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_message_digester.hxx
# Opt level: O1

char * __thiscall
cryptox::
evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha1,160ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
::update<char_const*>
          (evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha1,160ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
           *this,char *first,char *last)

{
  ulong cnt;
  long lVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  uint8_t buffer [1024];
  evp_error local_478;
  source_location local_440;
  char local_428 [1024];
  
  if (first != last) {
    do {
      pcVar4 = first;
      uVar3 = 0;
      do {
        cnt = uVar3 + 1;
        local_428[uVar3] = pcVar4[uVar3];
        if (0x3fe < cnt) break;
        lVar1 = uVar3 + 1;
        uVar3 = cnt;
      } while (pcVar4 + lVar1 != last);
      iVar2 = EVP_DigestUpdate(*(EVP_MD_CTX **)this,local_428,cnt);
      if (iVar2 != 1) {
        local_478._16_8_ = 0;
        local_478._24_8_ = 0;
        local_478._32_8_ = 0;
        local_478._40_8_ = 0xffffffff;
        local_478._0_8_ = 0x2e4238;
        local_478._8_8_ = 0x2e4268;
        local_440.file_ =
             "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/include/cryptox/message_digests/basic_message_digester.hxx"
        ;
        local_440.function_ =
             "Input cryptox::evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha1, 160>, &EVP_DigestInit_ex, &EVP_DigestUpdate, &EVP_DigestFinal_ex>::update(Input, Input) [Algorithm = cryptox::message_digest_algorithm<&EVP_sha1, 160>, InitFx = &EVP_DigestInit_ex, UpdateFx = &EVP_DigestUpdate, FinalFx = &EVP_DigestFinal_ex, Input = const char *]"
        ;
        local_440.line_ = 0x3f;
        local_440.column_ = 0;
        boost::throw_exception<cryptox::evp_error>(&local_478,&local_440);
      }
      first = pcVar4 + cnt;
    } while (pcVar4 + cnt != last);
    first = pcVar4 + cnt;
  }
  return first;
}

Assistant:

Input update(Input first, Input last) {
			Input itr = first;

			while (itr != last) {
				std::uint8_t buffer[1024];
				size_t size = 0;

				const std::size_t element_size = sizeof(*itr);
				while (size + element_size < sizeof(buffer) && itr != last) {
					const std::uint8_t* bytes = (const std::uint8_t*)&*itr++;
					std::copy(bytes, bytes + element_size, &buffer[size]);
					size += element_size;
				}

				if (UpdateFx(_context, buffer, size) != 1)
					BOOST_THROW_EXCEPTION(evp_error());
			}

			return itr;
		}